

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewDocPI(xmlDocPtr doc,xmlChar *name,xmlChar *content)

{
  xmlChar *pxVar1;
  _xmlDtd *p_Var2;
  xmlRegisterNodeFunc *pp_Var3;
  xmlNodePtr cur;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if (name == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x78);
    if (doc_local == (xmlDocPtr)0x0) {
      xmlTreeErrMemory("building PI");
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x78);
      doc_local->type = XML_PI_NODE;
      if ((doc == (xmlDocPtr)0x0) || (doc->dict == (_xmlDict *)0x0)) {
        pxVar1 = xmlStrdup(name);
        doc_local->name = (char *)pxVar1;
      }
      else {
        pxVar1 = xmlDictLookup(doc->dict,name,-1);
        doc_local->name = (char *)pxVar1;
      }
      if (content != (xmlChar *)0x0) {
        p_Var2 = (_xmlDtd *)xmlStrdup(content);
        doc_local->intSubset = p_Var2;
      }
      doc_local->doc = doc;
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var3 = __xmlRegisterNodeDefaultValue(), *pp_Var3 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var3 = __xmlRegisterNodeDefaultValue();
        (**pp_Var3)((xmlNodePtr)doc_local);
      }
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlNewDocPI(xmlDocPtr doc, const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewPI : name == NULL\n");
#endif
	return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building PI");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_PI_NODE;

    if ((doc != NULL) && (doc->dict != NULL))
        cur->name = xmlDictLookup(doc->dict, name, -1);
    else
	cur->name = xmlStrdup(name);
    if (content != NULL) {
	cur->content = xmlStrdup(content);
    }
    cur->doc = doc;

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}